

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
emplace_helper<QOpenGL2GradientCache::CacheInfo>
          (iterator *__return_storage_ptr__,
          QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this,
          unsigned_long_long *key,CacheInfo *args)

{
  qsizetype qVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Chain *pCVar6;
  MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this_00;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
  ::findOrInsert<unsigned_long_long>((InsertionResult *)local_58,this->d,key);
  this_00 = (MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)
            ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries +
            (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
            [(uint)local_58._8_8_ & 0x7f]);
  if (local_58[0x10] == false) {
    pCVar6 = (Chain *)operator_new(0x38);
    (pCVar6->value).texId = args->texId;
    uVar2 = *(undefined4 *)&(args->stops).d.d;
    uVar3 = *(undefined4 *)((long)&(args->stops).d.d + 4);
    uVar4 = *(undefined4 *)&(args->stops).d.ptr;
    uVar5 = *(undefined4 *)((long)&(args->stops).d.ptr + 4);
    (args->stops).d.d = (Data *)0x0;
    (args->stops).d.ptr = (pair<double,_QColor> *)0x0;
    *(undefined4 *)&(pCVar6->value).stops.d.d = uVar2;
    *(undefined4 *)((long)&(pCVar6->value).stops.d.d + 4) = uVar3;
    *(undefined4 *)&(pCVar6->value).stops.d.ptr = uVar4;
    *(undefined4 *)((long)&(pCVar6->value).stops.d.ptr + 4) = uVar5;
    qVar1 = (args->stops).d.size;
    (args->stops).d.size = 0;
    (pCVar6->value).stops.d.size = qVar1;
    (pCVar6->value).opacity = args->opacity;
    (pCVar6->value).interpolationMode = args->interpolationMode;
    pCVar6->next = (MultiNodeChain<QOpenGL2GradientCache::CacheInfo> *)0x0;
    this_00->key = *key;
    this_00->value = pCVar6;
  }
  else {
    QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
    insertMulti<QOpenGL2GradientCache::CacheInfo>(this_00,args);
  }
  this->m_size = this->m_size + 1;
  (__return_storage_ptr__->i).d =
       (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *)
       local_58._0_8_;
  (__return_storage_ptr__->i).bucket = local_58._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *)
      local_58._0_8_ !=
      (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *)0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
          [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f]].storage.data + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }